

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

object_ptr __thiscall
mjs::make_regexp(mjs *this,gc_heap_ptr<mjs::global_object> *global,string *pattern,string *flags)

{
  regexp_flag flags_00;
  global_object *global_00;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  wstring_view local_48;
  undefined1 local_38 [24];
  string *flags_local;
  string *pattern_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_38._16_8_ = flags;
  flags_local = pattern;
  pattern_local = (string *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  local_48 = string::view(pattern);
  global_00 = gc_heap_ptr<mjs::global_object>::operator*
                        ((gc_heap_ptr<mjs::global_object> *)pattern_local);
  flags_00 = parse_regexp_flags(global_00,(string *)local_38._16_8_);
  regexp_object::make((regexp_object *)local_38,global,&local_48,flags_00);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::regexp_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::regexp_object> *)local_38);
  gc_heap_ptr<mjs::regexp_object>::~gc_heap_ptr((gc_heap_ptr<mjs::regexp_object> *)local_38);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_regexp(const gc_heap_ptr<global_object>& global, const string& pattern, const string& flags) {
    return regexp_object::make(global, pattern.view(), parse_regexp_flags(*global, flags));
}